

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O1

void __thiscall
chrono::utils::ChISO2631_5_Wz::Filter
          (ChISO2631_5_Wz *this,vector<double,_std::allocator<double>_> *u,
          vector<double,_std::allocator<double>_> *y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  value_type_conflict1 *__val;
  ulong *puVar6;
  long lVar7;
  size_t __n;
  ulong uVar8;
  ulong *puVar9;
  int j;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  pointer pdVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  ChMatrixDynamic<> x;
  vector<double,_std::allocator<double>_> asz;
  DenseStorage<double,__1,__1,__1,_1> local_78;
  undefined8 *local_58;
  undefined8 *puStack_50;
  undefined8 *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  long local_38;
  
  local_58 = (undefined8 *)0x0;
  puStack_50 = (undefined8 *)0x0;
  local_48 = (undefined8 *)0x0;
  local_58 = (undefined8 *)::operator_new(0x40);
  puStack_50 = local_58 + 8;
  *local_58 = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_48 = puStack_50;
  std::vector<double,std::allocator<double>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((vector<double,std::allocator<double>> *)&local_58,puStack_50,
             (u->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (u->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  uVar8 = (long)puStack_50 - (long)local_58;
  local_78.m_data = (double *)0x0;
  local_40 = y;
  std::vector<double,_std::allocator<double>_>::resize
            (y,(long)uVar8 >> 3,(value_type_conflict1 *)&local_78);
  local_78.m_data = (double *)0x0;
  local_78.m_rows = 0;
  local_78.m_cols = 0;
  lVar7 = (long)(int)(uVar8 >> 3);
  if (lVar7 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_78,lVar7 * 7,lVar7,7);
  if (0x40 < (ulong)((long)puStack_50 - (long)local_58)) {
    lVar13 = 0x38;
    lVar7 = 0x40;
    lVar12 = 0;
    uVar8 = 9;
    do {
      lVar10 = 1;
      puVar9 = &m_w;
      local_38 = lVar7;
      do {
        auVar16 = ZEXT816(0) << 0x40;
        lVar7 = 7;
        puVar6 = puVar9;
        do {
          auVar18._8_8_ = 0;
          auVar18._0_8_ =
               *(ulong *)((long)(local_40->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar7 * 8 + lVar12);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *puVar6;
          auVar16 = vfmadd231sd_fma(auVar16,auVar18,auVar1);
          lVar7 = lVar7 + -1;
          puVar6 = puVar6 + 7;
        } while (lVar7 != 3);
        puVar6 = (ulong *)((long)local_58 + lVar13);
        auVar20 = ZEXT864(0);
        lVar7 = 0x1c;
        do {
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *puVar6;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = puVar9[lVar7];
          auVar1 = vfmadd231sd_fma(auVar20._0_16_,auVar21,auVar2);
          auVar20 = ZEXT1664(auVar1);
          puVar6 = puVar6 + -1;
          lVar7 = lVar7 + 7;
        } while (lVar7 != 0x54);
        dVar15 = tanh(auVar16._0_8_ + auVar1._0_8_ + *(double *)(&UNK_00a1a6c8 + lVar10 * 8));
        if ((local_78.m_rows < (long)uVar8) || (local_78.m_cols < lVar10)) goto LAB_009533ab;
        local_78.m_data[local_78.m_cols * (uVar8 - 1) + lVar10 + -1] = dVar15;
        lVar10 = lVar10 + 1;
        puVar9 = puVar9 + 1;
      } while (lVar10 != 8);
      pdVar3 = (local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3[uVar8 - 1] = 0.0;
      if (local_78.m_rows < (long)uVar8) {
LAB_009533ab:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                     );
      }
      uVar11 = 0;
      do {
        if ((~(local_78.m_cols >> 0x3f) & local_78.m_cols) == uVar11) goto LAB_009533ab;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = (&m_W)[uVar11];
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)((long)local_78.m_data + uVar11 * 8 + local_78.m_cols * local_38);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = pdVar3[uVar8 - 1];
        auVar16 = vfmadd213sd_fma(auVar19,auVar17,auVar16);
        pdVar3[uVar8 - 1] = auVar16._0_8_;
        uVar11 = uVar11 + 1;
      } while (uVar11 != 7);
      pdVar3[uVar8 - 1] = pdVar3[uVar8 - 1] + 21.51959;
      lVar12 = lVar12 + 8;
      lVar13 = lVar13 + 8;
      lVar7 = local_38 + 8;
      bVar5 = uVar8 < (ulong)((long)puStack_50 - (long)local_58 >> 3);
      uVar8 = uVar8 + 1;
    } while (bVar5);
  }
  pdVar14 = (local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar3 = pdVar14 + 8;
  __n = (long)(local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pdVar3;
  if (__n != 0) {
    memmove(pdVar14,pdVar3,__n);
  }
  pdVar4 = (local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar14 = (pointer)((long)pdVar14 + ((long)pdVar4 - (long)pdVar3));
  if (pdVar4 != pdVar14) {
    (local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar14;
  }
  if (local_78.m_data != (double *)0x0) {
    free((void *)local_78.m_data[-1]);
  }
  if (local_58 != (undefined8 *)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return;
}

Assistant:

void ChISO2631_5_Wz::Filter(std::vector<double>& u, std::vector<double>& y) {
    std::vector<double> asz(8);
    asz.insert(asz.end(), u.begin(), u.end());
    int asz_size = static_cast<int>(asz.size());
    y.resize(asz.size(), 0.0);
    ChMatrixDynamic<> x(asz_size, 7);
    // indices run from 1 to N to make it compatible to Matlab
    for (int t = 9; t <= asz.size(); t++) {
        for (int j = 1; j <= 7; j++) {
            double S1 = 0.0;
            for (int k = 1; k <= 4; k++) {
                S1 += y[t - k - 1] * m_w[k - 1][j - 1];
            }
            double S2 = 0.0;
            int kk = 1;
            for (int k = 5; k <= 12; k++) {
                S2 += asz[t - kk - 1] * m_w[k - 1][j - 1];
                kk++;
            }
            x(t - 1, j - 1) = tanh(S1 + S2 + m_w[12][j - 1]);
        }
        y[t - 1] = 0.0;
        for (int k = 1; k <= 7; k++) {
            y[t - 1] += m_W[k - 1] * x(t - 1, k - 1);
        }
        y[t - 1] += m_W[7];
    }
    y.erase(y.begin(), y.begin() + 8);  // get rid of leading zeros
}